

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>_> __thiscall
kj::heap<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>,kj::Own<kj::File>>
          (kj *this,Own<kj::File> *params)

{
  BrokenReplacer<kj::File> *this_00;
  Own<kj::File> *other;
  BrokenReplacer<kj::File> *extraout_RDX;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>_> OVar1;
  Own<const_kj::File> local_28;
  NoInfer<kj::Own<kj::File>_> *local_18;
  Own<kj::File> *params_local;
  
  local_18 = params;
  params_local = (Own<kj::File> *)this;
  this_00 = (BrokenReplacer<kj::File> *)operator_new(0x20);
  other = fwd<kj::Own<kj::File>>(local_18);
  Own<const_kj::File>::Own(&local_28,other);
  anon_unknown_35::InMemoryDirectory::BrokenReplacer<kj::File>::BrokenReplacer(this_00,&local_28);
  Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>_>::Own
            ((Own<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>_> *)this,
             this_00,(Disposer *)
                     &_::
                      HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>>
                      ::instance);
  Own<const_kj::File>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}